

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O0

RPCHelpMan * importmempool(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff098;
  allocator<RPCArg> *this;
  RPCArg *this_00;
  UniValue *in_stack_fffffffffffff0a0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff0a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0d0;
  UniValue *in_stack_fffffffffffff0d8;
  iterator in_stack_fffffffffffff0e0;
  RPCArgOptions *in_stack_fffffffffffff0e8;
  string *in_stack_fffffffffffff0f0;
  undefined7 in_stack_fffffffffffff0f8;
  undefined1 in_stack_fffffffffffff0ff;
  string *in_stack_fffffffffffff100;
  string *in_stack_fffffffffffff108;
  undefined1 *puVar2;
  RPCArg *in_stack_fffffffffffff110;
  string *in_stack_fffffffffffff118;
  RPCArg *in_stack_fffffffffffff120;
  undefined1 *local_ed8;
  RPCArgOptions *in_stack_fffffffffffff140;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  RPCHelpMan *this_01;
  allocator<char> local_d6c;
  allocator<char> local_d6b;
  allocator<char> local_d6a;
  allocator<char> local_d69;
  pointer local_d68;
  pointer pRStack_d60;
  pointer local_d58;
  allocator<char> local_d42;
  allocator<char> local_d41 [30];
  allocator<char> local_d23 [2];
  allocator<char> local_d21 [2];
  allocator<char> local_d1f;
  allocator<char> local_d1e [2];
  allocator<char> local_d1c;
  allocator<char> local_d1b [2];
  allocator<char> local_d19 [25];
  undefined8 in_stack_fffffffffffff300;
  undefined1 local_cf2;
  undefined1 local_cf1 [8];
  vector<RPCArg,_std::allocator<RPCArg>_> local_ce9;
  undefined1 local_cca [458];
  allocator<RPCArg> local_b00 [40];
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined1 local_ac0;
  undefined1 local_abf;
  undefined1 local_ab8;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined1 local_a78;
  undefined1 local_a77;
  undefined1 local_978;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined1 local_938;
  undefined1 local_937;
  undefined1 local_838;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined1 local_7f8;
  undefined1 local_7f7;
  undefined1 local_6f8 [792];
  undefined1 local_3e0 [160];
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  description = (string *)local_cca;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  args = &local_ce9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  local_cf1._1_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff0a8,&in_stack_fffffffffffff0a0->typ);
  results = (RPCResults *)local_cf1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff0b0);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff098);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff110,in_stack_fffffffffffff108,
                 (Type)((ulong)in_stack_fffffffffffff100 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
                 in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
  examples = (RPCExamples *)&local_cf2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff0a8,&in_stack_fffffffffffff0a0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  local_d1b[1] = (allocator<char>)0x1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff0d8,(bool *)in_stack_fffffffffffff0d0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  local_838 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff0b0);
  local_810 = 0;
  uStack_808 = 0;
  local_800 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff098);
  local_7f8 = 0;
  local_7f7 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff110,in_stack_fffffffffffff108,
                 (Type)((ulong)in_stack_fffffffffffff100 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
                 in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  local_d1e[1] = (allocator<char>)0x0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff0d8,(bool *)in_stack_fffffffffffff0d0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  local_978 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff0b0);
  local_950 = 0;
  uStack_948 = 0;
  local_940 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff098);
  local_938 = 0;
  local_937 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff110,in_stack_fffffffffffff108,
                 (Type)((ulong)in_stack_fffffffffffff100 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
                 in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  local_d21[1] = (allocator<char>)0x0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff0d8,(bool *)in_stack_fffffffffffff0d0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  local_ab8 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff0b0);
  local_a90 = 0;
  uStack_a88 = 0;
  local_a80 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff098);
  local_a78 = 0;
  local_a77 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff110,in_stack_fffffffffffff108,
                 (Type)((ulong)in_stack_fffffffffffff100 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
                 in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff098);
  __l._M_len = (size_type)in_stack_fffffffffffff0e8;
  __l._M_array = in_stack_fffffffffffff0e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff0d8,__l,
             (allocator_type *)in_stack_fffffffffffff0d0);
  local_b00[0] = (allocator<RPCArg>)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  local_ad8 = 0;
  uStack_ad0 = 0;
  local_ac8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff098);
  local_ac0 = 0;
  local_abf = 0;
  this = local_b00;
  RPCArg::RPCArg(in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                 (Type)((ulong)in_stack_fffffffffffff110 >> 0x20),
                 (Fallback *)in_stack_fffffffffffff108,in_stack_fffffffffffff100,
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
                 in_stack_fffffffffffff140);
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len = (size_type)in_stack_fffffffffffff0e8;
  __l_00._M_array = in_stack_fffffffffffff0e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff0d8,__l_00,
             (allocator_type *)in_stack_fffffffffffff0d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  local_d68 = (pointer)0x0;
  pRStack_d60 = (pointer)0x0;
  local_d58 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffff120,(Type)((ulong)in_stack_fffffffffffff118 >> 0x20)
             ,&in_stack_fffffffffffff110->m_names,in_stack_fffffffffffff108,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff100,
             (bool)in_stack_fffffffffffff0ff);
  RPCResults::RPCResults
            ((RPCResults *)in_stack_fffffffffffff118,(RPCResult *)in_stack_fffffffffffff110);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  HelpExampleCli(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
             (allocator<char> *)in_stack_fffffffffffff0d8);
  HelpExampleRpc(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  std::operator+(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x5eda38);
  this_00 = (RPCArg *)&stack0xfffffffffffff270;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<importmempool()::__0,void>
            (in_stack_fffffffffffff0a8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff0a0);
  RPCHelpMan::RPCHelpMan
            (this_01,&in_RDI->m_name,description,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff300);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d6c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d6b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d6a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d69);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff0a8);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d42);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d41);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff0a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar2 = local_258;
  local_ed8 = local_48;
  do {
    local_ed8 = local_ed8 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (local_ed8 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::allocator<char>::~allocator(local_d23);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff0a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar2 = local_6f8;
  puVar1 = local_3e0;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d21);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d1f);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d1e);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_d1c);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d1b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_d19);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff307);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_cf1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_cca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_cca + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan importmempool()
{
    return RPCHelpMan{
        "importmempool",
        "Import a mempool.dat file and attempt to add its contents to the mempool.\n"
        "Warning: Importing untrusted files is dangerous, especially if metadata from the file is taken over.",
        {
            {"filepath", RPCArg::Type::STR, RPCArg::Optional::NO, "The mempool file"},
            {"options",
             RPCArg::Type::OBJ_NAMED_PARAMS,
             RPCArg::Optional::OMITTED,
             "",
             {
                 {"use_current_time", RPCArg::Type::BOOL, RPCArg::Default{true},
                  "Whether to use the current system time or use the entry time metadata from the mempool file.\n"
                  "Warning: Importing untrusted metadata may lead to unexpected issues and undesirable behavior."},
                 {"apply_fee_delta_priority", RPCArg::Type::BOOL, RPCArg::Default{false},
                  "Whether to apply the fee delta metadata from the mempool file.\n"
                  "It will be added to any existing fee deltas.\n"
                  "The fee delta can be set by the prioritisetransaction RPC.\n"
                  "Warning: Importing untrusted metadata may lead to unexpected issues and undesirable behavior.\n"
                  "Only set this bool if you understand what it does."},
                 {"apply_unbroadcast_set", RPCArg::Type::BOOL, RPCArg::Default{false},
                  "Whether to apply the unbroadcast set metadata from the mempool file.\n"
                  "Warning: Importing untrusted metadata may lead to unexpected issues and undesirable behavior."},
             },
             RPCArgOptions{.oneline_description = "options"}},
        },
        RPCResult{RPCResult::Type::OBJ, "", "", std::vector<RPCResult>{}},
        RPCExamples{HelpExampleCli("importmempool", "/path/to/mempool.dat") + HelpExampleRpc("importmempool", "/path/to/mempool.dat")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
            const NodeContext& node{EnsureAnyNodeContext(request.context)};

            CTxMemPool& mempool{EnsureMemPool(node)};
            ChainstateManager& chainman = EnsureChainman(node);
            Chainstate& chainstate = chainman.ActiveChainstate();

            if (chainman.IsInitialBlockDownload()) {
                throw JSONRPCError(RPC_CLIENT_IN_INITIAL_DOWNLOAD, "Can only import the mempool after the block download and sync is done.");
            }

            const fs::path load_path{fs::u8path(request.params[0].get_str())};
            const UniValue& use_current_time{request.params[1]["use_current_time"]};
            const UniValue& apply_fee_delta{request.params[1]["apply_fee_delta_priority"]};
            const UniValue& apply_unbroadcast{request.params[1]["apply_unbroadcast_set"]};
            node::ImportMempoolOptions opts{
                .use_current_time = use_current_time.isNull() ? true : use_current_time.get_bool(),
                .apply_fee_delta_priority = apply_fee_delta.isNull() ? false : apply_fee_delta.get_bool(),
                .apply_unbroadcast_set = apply_unbroadcast.isNull() ? false : apply_unbroadcast.get_bool(),
            };

            if (!node::LoadMempool(mempool, load_path, chainstate, std::move(opts))) {
                throw JSONRPCError(RPC_MISC_ERROR, "Unable to import mempool file, see debug.log for details.");
            }

            UniValue ret{UniValue::VOBJ};
            return ret;
        },
    };
}